

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O1

void __thiscall ON_Layer::SetPerViewportIsVisibleInNewDetails(ON_Layer *this,bool bVisible)

{
  ON_LayerPrivate *pOVar1;
  char cVar2;
  
  pOVar1 = this->m_private;
  if (pOVar1 == (ON_LayerPrivate *)0x0) {
    cVar2 = '\x01';
  }
  else {
    cVar2 = pOVar1->m_visible_in_new_details;
  }
  if ((bool)cVar2 != bVisible) {
    if (pOVar1 == (ON_LayerPrivate *)0x0) {
      pOVar1 = (ON_LayerPrivate *)operator_new(0x18);
      (pOVar1->m_custom_section_style).
      super___shared_ptr<ON_SectionStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      (pOVar1->m_custom_section_style).
      super___shared_ptr<ON_SectionStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      *(undefined8 *)&pOVar1->m_visible_in_new_details = 0;
      pOVar1->m_visible_in_new_details = true;
      this->m_private = pOVar1;
    }
    this->m_private->m_visible_in_new_details = bVisible;
  }
  return;
}

Assistant:

void ON_Layer::SetPerViewportIsVisibleInNewDetails(bool bVisible)
{
  if (PerViewportIsVisibleInNewDetails() == bVisible)
    return;
  if (nullptr == m_private)
    m_private = new ON_LayerPrivate();
  m_private->m_visible_in_new_details = bVisible;
}